

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O3

int Dau_DecPerform6(word *p,int nVars,uint uSet)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  word wVar12;
  long lVar13;
  int nVarsD;
  int nVarsC;
  int nVarsS;
  word tComp;
  uint local_8d0;
  int local_8cc;
  ulong local_8c8;
  ulong local_8c0;
  ulong local_8b8;
  ulong local_8b0;
  word *local_8a8;
  ulong local_8a0;
  word tDec0;
  ulong local_890;
  int pPermD [16];
  int pPermC [16];
  char pDsdD [1000];
  char pDsdC [1000];
  
  tComp = 0;
  local_8cc = nVars;
  local_8a8 = p;
  iVar1 = Dau_DecDecomposeSet(p,nVars,uSet,&tComp,&tDec0,pPermC,pPermD,&nVarsC,&nVarsD,&nVarsS);
  if (iVar1 == 0) {
    puts("  Decomposition does not exist");
    iVar1 = 0;
  }
  else {
    uVar6 = nVarsC - 1;
    if (5 < uVar6) {
      __assert_fail("iVar >= 0 && iVar < 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x337,"word Abc_Tt6Cofactor0(word, int)");
    }
    lVar2 = (long)nVarsS;
    uVar8 = nVarsC + ~nVarsS;
    local_8b0 = (ulong)uVar8;
    bVar4 = (byte)(1 << ((byte)uVar6 & 0x1f));
    lVar13 = (long)nVarsD;
    local_8d0 = 1 << ((byte)(1 << ((byte)nVarsS & 0x1f)) & 0x1f);
    local_8b8 = (s_Truths6Neg[uVar6] & tComp) << (bVar4 & 0x3f) | s_Truths6Neg[uVar6] & tComp;
    local_8c0 = (tComp & s_Truths6[uVar6]) >> (bVar4 & 0x3f) | tComp & s_Truths6[uVar6];
    local_8c8 = tDec0;
    if ((int)local_8d0 < 2) {
      local_8d0 = 1;
    }
    local_8a0 = 0;
    uVar5 = 0;
    uVar6 = local_8d0;
    do {
      if ((uVar5 & 1) == 0) {
        if ((ulong)(uint)nVarsS == 0x1f) {
          local_890 = 0;
          uVar3 = 0;
        }
        else {
          uVar3 = 0;
          local_890 = 0;
          uVar6 = 0;
          do {
            if ((uVar5 >> (uVar6 & 0x1f) & 1) != 0) {
              if (nVarsS < 1) {
                uVar9 = 0xffffffffffffffff;
                uVar7 = 0xffffffffffffffff;
              }
              else {
                uVar7 = 0xffffffffffffffff;
                uVar10 = 0;
                uVar9 = 0xffffffffffffffff;
                do {
                  uVar11 = s_Truths6[uVar10 + (long)(int)uVar8];
                  if ((uVar6 >> ((uint)uVar10 & 0x1f) & 1) == 0) {
                    uVar11 = ~uVar11;
                    wVar12 = ~s_Truths6[uVar10 + (lVar13 - lVar2)];
                  }
                  else {
                    wVar12 = s_Truths6[uVar10 + (lVar13 - lVar2)];
                  }
                  uVar7 = uVar7 & wVar12;
                  uVar9 = uVar9 & uVar11;
                  uVar10 = uVar10 + 1;
                } while ((uint)nVarsS != uVar10);
              }
              uVar3 = uVar3 | uVar9;
              local_890 = local_890 | uVar7;
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 != 1 << ((byte)nVarsS & 0x1f));
        }
        local_890 = local_890 ^ local_8c8;
        uVar7 = uVar3 & local_8c0 | local_8b8 & ~uVar3;
        tComp = ((uVar3 & local_8b8 | ~uVar3 & local_8c0) ^ uVar7) &
                s_Truths6[nVarsS + (int)local_8b0] ^ uVar7;
        Dau_DsdDecompose(&tComp,nVarsC,0,1,pDsdC);
        Dau_DsdDecompose(&local_890,nVarsD,0,1,pDsdD);
        Dau_DecVarReplace(pDsdD,pPermD,nVarsD);
        Dau_DecVarReplace(pDsdC,pPermC,nVarsC);
        iVar1 = (int)local_8a0;
        printf("%3d : ");
        printf("%24s  ",pDsdD);
        printf("%24s  ",pDsdC);
        Dau_DecVerify(local_8a8,local_8cc,pDsdC,pDsdD);
        local_8a0 = (ulong)(iVar1 + 1);
        uVar6 = local_8d0;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar6);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Dau_DecPerform6( word * p, int nVars, unsigned uSet )
{
    word tComp = 0, tDec = 0, tDec0, tComp0, tComp1, FuncC, FuncD;
    char pDsdC[1000], pDsdD[1000];
    int pPermC[16], pPermD[16];
    int nVarsC, nVarsD, nVarsS, nVarsU, nVarsF, nPairs;
    int i, m, v, status, ResC, ResD, Counter = 0;
    status = Dau_DecDecomposeSet( p, nVars, uSet, &tComp, &tDec0, pPermC, pPermD, &nVarsC, &nVarsD, &nVarsS );
    if ( !status )
    {
        printf( "  Decomposition does not exist\n" );
        return 0;
    }
    nVarsU = nVarsD - nVarsS;
    nVarsF = nVarsC - nVarsS - 1;
    tComp0 = Abc_Tt6Cofactor0( tComp, nVarsF + nVarsS );
    tComp1 = Abc_Tt6Cofactor1( tComp, nVarsF + nVarsS );
    nPairs = 1 << (1 << nVarsS); 
    for ( i = 0; i < nPairs; i++ )
    {
        if ( i & 1 )
            continue;
        // create miterms with this polarity
        FuncC = FuncD = 0;
        for ( m = 0; m < (1 << nVarsS); m++ )
        {
            word MintC, MintD;
            if ( !((i >> m) & 1) )
                continue;
            MintC = MintD = ~(word)0;
            for ( v = 0; v < nVarsS; v++ )
            {
                MintC &= ((m >> v) & 1) ? s_Truths6[nVarsF+v] : ~s_Truths6[nVarsF+v];
                MintD &= ((m >> v) & 1) ? s_Truths6[nVarsU+v] : ~s_Truths6[nVarsU+v];
            }
            FuncC |= MintC;
            FuncD |= MintD;
        }
        // uncomplement given variables
        tComp = (~s_Truths6[nVarsF + nVarsS] & ((tComp0 & ~FuncC) | (tComp1 & FuncC))) | (s_Truths6[nVarsF + nVarsS] & ((tComp1 & ~FuncC) | (tComp0 & FuncC)));
        tDec = tDec0 ^ FuncD;
        // decompose
        ResC = Dau_DsdDecompose( &tComp, nVarsC, 0, 1, pDsdC );
        ResD = Dau_DsdDecompose( &tDec, nVarsD, 0, 1, pDsdD );
        // replace variables
        Dau_DecVarReplace( pDsdD, pPermD, nVarsD );
        Dau_DecVarReplace( pDsdC, pPermC, nVarsC );
        // report
//        printf( "  " );
        printf( "%3d : ", Counter++ );
        printf( "%24s  ", pDsdD );
        printf( "%24s  ", pDsdC );
        Dau_DecVerify( p, nVars, pDsdC, pDsdD );
    }
    return 1;
}